

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined8 in_RAX;
  char *pcVar6;
  ATTRIBUTE *pAVar7;
  char **ppcVar8;
  byte *pbVar9;
  uint uVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  long lVar12;
  byte *ptr_00;
  int tok;
  undefined8 uStack_38;
  uint uVar11;
  
  pAVar7 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar7 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if (pAVar7 == (ATTRIBUTE *)0x1) {
        return -2;
      }
      iVar5 = (*enc[3].nameLength)(enc,ptr);
      if (iVar5 != 0) goto LAB_0066489c;
      iVar5 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_00,&pAVar7->name);
      lVar12 = 2;
    }
    else if (bVar1 == 6) {
      if (pAVar7 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar6 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar6 != 0) goto LAB_0066489c;
      iVar5 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_01,&pAVar7->name);
      lVar12 = 3;
    }
    else {
      if (bVar1 != 7) goto LAB_0066489c;
      if (pAVar7 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar5 = (*enc[3].getAtts)(enc,ptr,(int)end,pAVar7);
      if (iVar5 != 0) goto LAB_0066489c;
      iVar5 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX,(char *)pAVar7);
      lVar12 = 4;
    }
    if (iVar5 == 0) {
LAB_0066489c:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  else {
    lVar12 = 1;
    if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_0066489c;
  }
  ptr_00 = (byte *)(ptr + lVar12);
  uVar4 = uStack_38;
  do {
    uVar2 = (long)end - (long)ptr_00;
    if ((long)uVar2 < 1) {
      return -1;
    }
    uStack_38._4_4_ = (int)((ulong)uVar4 >> 0x20);
    uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
    uVar10 = uVar11 - 5;
    if (0x18 < uVar10) {
switchD_00664952_caseD_8:
      pbVar9 = ptr_00;
LAB_00664b53:
      *nextTokPtr = (char *)pbVar9;
      return 0;
    }
    ppcVar8 = (char **)0x1;
    uStack_38 = uVar4;
    switch(uVar11) {
    case 5:
      if (uVar2 == 1) {
        return -2;
      }
      iVar5 = (*enc[3].nameLength)(enc,(char *)ptr_00);
      if (iVar5 != 0) goto switchD_00664952_caseD_1d;
      iVar5 = (*enc[3].scanners[0])(enc,(char *)ptr_00,extraout_RDX_02,ppcVar8);
      ppcVar8 = (char **)0x2;
      break;
    case 6:
      if (uVar2 < 3) {
        return -2;
      }
      pcVar6 = (*enc[3].skipS)(enc,(char *)ptr_00);
      if ((int)pcVar6 != 0) goto switchD_00664952_caseD_1d;
      iVar5 = (*enc[3].scanners[1])(enc,(char *)ptr_00,extraout_RDX_04,ppcVar8);
      ppcVar8 = (char **)0x3;
      break;
    case 7:
      if (uVar2 < 4) {
        return -2;
      }
      iVar5 = (*enc[3].getAtts)(enc,(char *)ptr_00,
                                (&switchD_00664952::switchdataD_0088723c)[uVar10] + 0x88723c,
                                (ATTRIBUTE *)0x1);
      if (iVar5 != 0) goto switchD_00664952_caseD_1d;
      iVar5 = (*enc[3].scanners[2])(enc,(char *)ptr_00,extraout_RDX_03,ppcVar8);
      ppcVar8 = (char **)0x4;
      break;
    default:
      goto switchD_00664952_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar5 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar5 == 0) goto switchD_00664952_caseD_1d;
      pbVar9 = ptr_00 + 1;
      uVar4 = extraout_RDX_05;
      uVar3 = uStack_38;
      goto joined_r0x00664a3d;
    case 0xf:
      iVar5 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar5 == 0) goto switchD_00664952_caseD_1d;
      pbVar9 = ptr_00 + 1;
      if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
        return -1;
      }
      if (*pbVar9 != 0x3e) goto LAB_00664b53;
      goto LAB_00664b38;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_00664952_caseD_16;
    case 0x1d:
      goto switchD_00664952_caseD_1d;
    }
    uVar4 = uStack_38;
    if (iVar5 == 0) goto switchD_00664952_caseD_1d;
switchD_00664952_caseD_16:
    uStack_38 = uVar4;
    ptr_00 = ptr_00 + (long)ppcVar8;
    uVar4 = uStack_38;
  } while( true );
joined_r0x00664a3d:
  ptr_00 = pbVar9;
  uVar2 = (long)end - (long)ptr_00;
  if ((long)uVar2 < 1) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
  if (0xf < (ulong)bVar1) {
switchD_00664a62_caseD_2:
    pbVar9 = ptr_00 + 1;
    goto joined_r0x00664a3d;
  }
  uStack_38 = uVar3;
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
switchD_00664952_caseD_1d:
    *nextTokPtr = (char *)ptr_00;
    return 0;
  default:
    goto switchD_00664a62_caseD_2;
  case 5:
    if (uVar2 == 1) {
      return -2;
    }
    iVar5 = (*enc[3].nameLength)(enc,(char *)ptr_00);
    if (iVar5 != 0) goto switchD_00664952_caseD_1d;
    pbVar9 = ptr_00 + 2;
    uVar4 = extraout_RDX_06;
    uVar3 = uStack_38;
    break;
  case 6:
    if (uVar2 < 3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,(char *)ptr_00);
    if ((int)pcVar6 != 0) goto switchD_00664952_caseD_1d;
    pbVar9 = ptr_00 + 3;
    uVar4 = extraout_RDX_07;
    uVar3 = uStack_38;
    break;
  case 7:
    if (uVar2 < 4) {
      return -2;
    }
    iVar5 = (*enc[3].getAtts)(enc,(char *)ptr_00,(int)uVar4,
                              (ATTRIBUTE *)
                              ((long)&switchD_00664a62::switchdataD_008872a0 +
                              (long)(int)(&switchD_00664a62::switchdataD_008872a0)[bVar1]));
    if (iVar5 != 0) goto switchD_00664952_caseD_1d;
    pbVar9 = ptr_00 + 4;
    uVar4 = extraout_RDX_08;
    uVar3 = uStack_38;
    break;
  case 0xf:
    pbVar9 = ptr_00 + 1;
    if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
      return -1;
    }
    if (*pbVar9 == 0x3e) {
LAB_00664b38:
      *nextTokPtr = (char *)(ptr_00 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x00664a3d;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}